

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O2

Own<capnp::ClientHook> capnp::anon_unknown_0::newNullCap(void)

{
  uint *puVar1;
  BrokenClient *this;
  ClientHook *extraout_RDX;
  Disposer *in_RDI;
  Own<capnp::ClientHook> OVar2;
  StringPtr description;
  Own<capnp::(anonymous_namespace)::BrokenClient> local_20;
  
  this = (BrokenClient *)operator_new(0x180);
  description.content.size_ = 0x18;
  description.content.ptr = "Called null capability.";
  BrokenClient::BrokenClient(this,description,true,&ClientHook::NULL_CAPABILITY_BRAND);
  puVar1 = &(this->super_Refcounted).refcount;
  *puVar1 = *puVar1 + 1;
  local_20.disposer = &(this->super_Refcounted).super_Disposer;
  in_RDI->_vptr_Disposer = (_func_int **)local_20.disposer;
  in_RDI[1]._vptr_Disposer = (_func_int **)this;
  local_20.ptr = (BrokenClient *)0x0;
  kj::Own<capnp::(anonymous_namespace)::BrokenClient>::~Own(&local_20);
  OVar2.ptr = extraout_RDX;
  OVar2.disposer = in_RDI;
  return OVar2;
}

Assistant:

kj::Own<ClientHook> newNullCap() {
  // A null capability, unlike other broken capabilities, is considered resolved.
  return kj::refcounted<BrokenClient>("Called null capability.", true,
                                      &ClientHook::NULL_CAPABILITY_BRAND);
}